

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O1

int lzop_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  long in_RAX;
  long *plVar2;
  ssize_t avail;
  long local_8;
  
  local_8 = in_RAX;
  plVar2 = (long *)__archive_read_filter_ahead(filter,9,&local_8);
  iVar1 = 0;
  if (((plVar2 != (long *)0x0) && (iVar1 = 0, local_8 != 0)) &&
     (iVar1 = 0x48, (char)plVar2[1] != '\n' || *plVar2 != 0x1a0a0d004f5a4c89)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
lzop_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, LZOP_HEADER_MAGIC_LEN, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LZOP_HEADER_MAGIC, LZOP_HEADER_MAGIC_LEN))
		return (0);

	return (LZOP_HEADER_MAGIC_LEN * 8);
}